

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# global_state.cpp
# Opt level: O1

global_state_t * cilkg_init_global_state(void)

{
  global_state_t *g;
  global_state_t *pgVar1;
  int iVar2;
  
  pgVar1 = cilkg_singleton_ptr;
  if (cilkg_singleton_ptr == (global_state_t *)0x0) {
    cilkg_get_user_settable_values();
    if ((anonymous_namespace)::global_state_singleton._952_4_ != 0) {
      if ((int)(anonymous_namespace)::global_state_singleton._952_4_ /
          (int)(anonymous_namespace)::global_state_singleton._1320_4_ <
          (int)(anonymous_namespace)::global_state_singleton._60_4_) {
        (anonymous_namespace)::global_state_singleton._60_4_ =
             (uint)(anonymous_namespace)::global_state_singleton._952_4_ /
             (uint)(anonymous_namespace)::global_state_singleton._1320_4_;
      }
      if ((int)(anonymous_namespace)::global_state_singleton._60_4_ < 1) {
        (anonymous_namespace)::global_state_singleton._60_4_ = 1;
      }
      if ((int)(anonymous_namespace)::global_state_singleton._952_4_ <
          (int)(anonymous_namespace)::global_state_singleton._1320_4_) {
        (anonymous_namespace)::global_state_singleton._952_4_ =
             (anonymous_namespace)::global_state_singleton._1320_4_;
      }
      (anonymous_namespace)::global_state_singleton._64_4_ =
           ((anonymous_namespace)::global_state_singleton._60_4_ + 1) *
           (anonymous_namespace)::global_state_singleton._1320_4_;
    }
    (anonymous_namespace)::global_state_singleton._0_2_ = 8;
    __cilkrts_init_stats((statistics *)((anonymous_namespace)::global_state_singleton + 0x50));
    __cilkrts_frame_malloc_global_init
              ((global_state_t *)(anonymous_namespace)::global_state_singleton);
    (anonymous_namespace)::global_state_singleton._1324_4_ = 0;
    cilkg_get_user_settable_values();
    iVar2 = 3;
    if (3 < (anonymous_namespace)::global_state_singleton._1320_4_ * 2) {
      iVar2 = (anonymous_namespace)::global_state_singleton._1320_4_ * 2;
    }
    if (0 < (int)(anonymous_namespace)::global_state_singleton._8_4_) {
      iVar2 = (anonymous_namespace)::global_state_singleton._8_4_;
    }
    (anonymous_namespace)::global_state_singleton._12_4_ =
         iVar2 + (anonymous_namespace)::global_state_singleton._1320_4_ + -1;
    (anonymous_namespace)::global_state_singleton._4_4_ =
         (anonymous_namespace)::global_state_singleton._1320_4_ + -1;
    (anonymous_namespace)::global_state_singleton._68_4_ = 0;
    (anonymous_namespace)::global_state_singleton._16_4_ = 0;
    (anonymous_namespace)::global_state_singleton._48_8_ = 0x400;
    (anonymous_namespace)::global_state_singleton._960_8_ =
         cilkos_validate_stack_size((anonymous_namespace)::global_state_singleton._960_8_);
    (anonymous_namespace)::global_state_singleton._1160_4_ = 0;
    pgVar1 = (global_state_t *)(anonymous_namespace)::global_state_singleton;
  }
  return pgVar1;
}

Assistant:

global_state_t* cilkg_init_global_state()
{
    if (cilkg_singleton_ptr)
        return cilkg_singleton_ptr;

    // Get partially-initialized global state.
    global_state_t* g = cilkg_get_user_settable_values();

    if (g->max_stacks > 0) {

        // nstacks is currently honored on non-Windows systems only.

        // Set an upper bound on the number of stacks that are allocated.  If
        // nstacks is set, each worker gets up to one stack in its cache so that
        // no one worker can hog all of the free stacks and keep work from being
        // stolen by the other workers.

        // nstacks corresponds to the number of stacks that will be allocated by
        // the runtime apart from the initial stack created for each thread by
        // the system.  Therefore, if a user asks for n stacks, and there are
        // p workers created, the total number of stacks is actually n + p.

        // This feature is primarily for MIC which has flat memory
        // instead of virtual addresses and tends to run out really quickly.
        // It is not implemented for Windows and it's non-intuitive
        // interaction with the local stack cache is specifically to help out
        // MIC.

        // About max_stacks / P stacks, except we require at least 1
        // per pool.
        if (((int)g->max_stacks / g->P) < g->fiber_pool_size)
            g->fiber_pool_size = g->max_stacks / g->P;

        if (g->fiber_pool_size <= 0) {
            g->fiber_pool_size = 1;
        }
        
        if ((int)g->max_stacks < g->P)
            g->max_stacks = g->P;

        g->global_fiber_pool_size = g->P * (g->fiber_pool_size+1);
    }

    // Number of bytes/address - validation for debugger integration
    g->addr_size = sizeof(void *);

    __cilkrts_init_stats(&g->stats);

    __cilkrts_frame_malloc_global_init(g);

    g->Q = 0;
    g->total_workers = cilkg_calc_total_workers();
    g->system_workers = g->P - 1; // system_workers is here for the debugger.
    g->work_done = 0;
    g->workers_running = 0;
    g->ltqsize = 1024; /* FIXME */

    g->stack_size = cilkos_validate_stack_size(g->stack_size);
    g->failure_to_allocate_stack = 0;

    return g;
}